

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParsingTools.hpp
# Opt level: O0

char * Diligent::Parsing::SkipIdentifier<char_const*>(char **Start,char **End)

{
  int iVar1;
  bool bVar2;
  char **local_28;
  char *Pos;
  char **End_local;
  char **Start_local;
  
  if (*Start == *End) {
    Start_local = (char **)*Start;
  }
  else {
    Start_local = (char **)*Start;
    iVar1 = isalpha((int)*(char *)Start_local);
    if ((iVar1 != 0) || (*(char *)Start_local == '_')) {
      do {
        local_28 = (char **)((long)Start_local + 1);
        bVar2 = false;
        if (local_28 != (char **)*End) {
          iVar1 = isalnum((int)*(char *)local_28);
          bVar2 = true;
          if (iVar1 == 0) {
            bVar2 = *(char *)local_28 == '_';
          }
        }
        Start_local = local_28;
      } while (bVar2);
    }
  }
  return (char *)Start_local;
}

Assistant:

IteratorType SkipIdentifier(const IteratorType& Start, const IteratorType& End) noexcept
{
    if (Start == End)
        return Start;

    auto Pos = Start;
    if (isalpha(*Pos) || *Pos == '_')
        ++Pos;
    else
        return Pos;

    while (Pos != End && (isalnum(*Pos) || *Pos == '_'))
        ++Pos;

    return Pos;
}